

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O2

fe_node * fe_load_node(fe_state *s)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  fe_node *pfVar4;
  int i;
  fe_state *s_00;
  ulong uVar5;
  fe_node_fill *unaff_R14;
  long lVar6;
  fe_grad *pfVar7;
  bool bVar8;
  float fVar9;
  fe_node nd;
  
  s_00 = s;
  read_token(s);
  if (s->error != true) {
    pcVar1 = s->token;
    if (*pcVar1 != '*') {
      s->error = true;
      s->token = pcVar1 + 1;
      error();
      pfVar4 = (fe_node *)s_00->data;
      s_00->token = (char *)pfVar4;
      iVar2 = s_00->size;
      do {
        if (iVar2 < 1) {
          return pfVar4;
        }
        uVar5 = (ulong)(byte)pfVar4->id;
        if (uVar5 < 0x3b) {
          if ((0x400100000000401U >> (uVar5 & 0x3f) & 1) != 0) {
LAB_001124fb:
            *(undefined1 *)&pfVar4->id = 0;
            s_00->data = s_00->data + 1;
            s_00->size = s_00->size + -1;
            return pfVar4;
          }
          if (uVar5 == 0xd) {
            *(undefined1 *)&pfVar4->id = 0;
            if (s_00->size < 1) {
              s_00->error = true;
              return pfVar4;
            }
            pfVar4 = (fe_node *)(s_00->data + 1);
            s_00->data = (char *)pfVar4;
            s_00->size = s_00->size + -1;
            goto LAB_001124fb;
          }
        }
        pfVar4 = (fe_node *)((long)&pfVar4->id + 1);
        s_00->data = (char *)pfVar4;
        iVar2 = iVar2 + -1;
        s_00->size = iVar2;
      } while( true );
    }
    s->token = pcVar1 + 1;
    if (s->error == false) {
      unaff_R14 = (fe_node_fill *)&nd;
      fe_node_init((fe_node *)unaff_R14,0,(get_node_image)0x0);
      nd.type = atoi(s->token);
      s_00 = s;
      nd.id = read_int(s);
      if (((((s->error != true) && (s_00 = s, nd.flags = read_int(s), s->error != true)) &&
           (s_00 = s, nd.x = read_int(s), s->error != true)) &&
          ((s_00 = s, nd.y = read_int(s), s->error != true &&
           (s_00 = s, nd.vis_x = read_int(s), s->error != true)))) &&
         (s_00 = s, nd.vis_y = read_int(s), s->error == false)) {
        for (lVar6 = 0x12; lVar6 != 0x16; lVar6 = lVar6 + 1) {
          s_00 = s;
          fVar9 = read_float(s);
          (&((fe_node *)(nd.in + -4))->id)[lVar6] = (int)fVar9;
        }
        unaff_R14 = (fe_node_fill *)0x16;
        if (s->error == false) {
          for (lVar6 = 0x16; lVar6 != 0x1a; lVar6 = lVar6 + 1) {
            s_00 = s;
            iVar2 = read_int(s);
            (&((fe_node *)(nd.in + -4))->id)[lVar6] = iVar2;
          }
          unaff_R14 = (fe_node_fill *)0x1a;
          if ((s->error == false) && (s_00 = s, read_token(s), s->error != true)) {
            pcVar1 = s->token;
            for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
              nd.name[lVar6] = pcVar1[lVar6];
            }
            if (nd.type == 0xc) {
              unaff_R14 = (fe_node_fill *)fe_node_fill_radial_alloc();
              s->data = s->data + 1;
              s->size = s->size + -1;
              s_00 = s;
              uVar3 = read_int(s);
              if (s->error != true) {
                pfVar7 = &unaff_R14->grad;
                (unaff_R14->grad).colors_num = uVar3;
                uVar5 = 0;
                if (0 < (int)uVar3) {
                  uVar5 = (ulong)uVar3;
                }
                do {
                  bVar8 = uVar5 == 0;
                  uVar5 = uVar5 - 1;
                  if (bVar8) {
                    s_00 = s;
                    uVar3 = read_int(s);
                    if (s->error == false) {
                      (unaff_R14->grad).alpha_num = uVar3;
                      uVar5 = 0;
                      if (0 < (int)uVar3) {
                        uVar5 = (ulong)uVar3;
                      }
                      lVar6 = 0x114;
                      goto LAB_001123c8;
                    }
                    break;
                  }
                  s_00 = s;
                  read_token(s);
                  if (s->error == true) break;
                  parse_color(s->token,pfVar7->colors);
                  s_00 = s;
                  fVar9 = read_float(s);
                  pfVar7->colors_pos[0] = fVar9;
                  pfVar7 = (fe_grad *)(pfVar7->colors + 1);
                } while (s->error != true);
              }
            }
            else {
              if (nd.type == 2) {
                unaff_R14 = (fe_node_fill *)fe_node_image_fixed_alloc();
                goto LAB_0011246b;
              }
              if (nd.type != 3) {
                if (nd.type == 1) {
                  unaff_R14 = (fe_node_fill *)fe_node_image_alloc();
                }
                else {
                  unaff_R14 = (fe_node_fill *)fe_node_alloc(nd.type);
                }
                goto LAB_0011246b;
              }
              unaff_R14 = fe_node_fill_alloc();
              s->data = s->data + 1;
              s->size = s->size + -1;
              s_00 = s;
              uVar3 = read_int(s);
              if (s->error != true) {
                pfVar7 = &unaff_R14->grad;
                (unaff_R14->grad).colors_num = uVar3;
                uVar5 = 0;
                if (0 < (int)uVar3) {
                  uVar5 = (ulong)uVar3;
                }
                do {
                  bVar8 = uVar5 == 0;
                  uVar5 = uVar5 - 1;
                  if (bVar8) {
                    s_00 = s;
                    uVar3 = read_int(s);
                    if (s->error == false) {
                      (unaff_R14->grad).alpha_num = uVar3;
                      uVar5 = 0;
                      if (0 < (int)uVar3) {
                        uVar5 = (ulong)uVar3;
                      }
                      lVar6 = 0x114;
                      goto LAB_00112359;
                    }
                    break;
                  }
                  s_00 = s;
                  read_token(s);
                  if (s->error == true) break;
                  parse_color(s->token,pfVar7->colors);
                  s_00 = s;
                  fVar9 = read_float(s);
                  pfVar7->colors_pos[0] = fVar9;
                  pfVar7 = (fe_grad *)(pfVar7->colors + 1);
                } while (s->error != true);
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0011240d;
  while( true ) {
    parse_alpha(s->token,(uchar *)((long)&((fe_node *)((unaff_R14->base).in + -4))->id + lVar6));
    s_00 = s;
    fVar9 = read_float(s);
    *(float *)((long)unaff_R14 + lVar6 * 4 + -0x32c) = fVar9;
    lVar6 = lVar6 + 1;
    if (s->error == true) break;
LAB_00112359:
    s_00 = s;
    if (lVar6 - uVar5 == 0x114) goto LAB_00112412;
    read_token(s);
    if (s->error == true) break;
  }
  goto LAB_0011240d;
  while( true ) {
    parse_alpha(s->token,(uchar *)((long)&((fe_node *)((unaff_R14->base).in + -4))->id + lVar6));
    s_00 = s;
    fVar9 = read_float(s);
    *(float *)((long)unaff_R14 + lVar6 * 4 + -0x32c) = fVar9;
    lVar6 = lVar6 + 1;
    if (s->error == true) break;
LAB_001123c8:
    if (lVar6 - uVar5 == 0x114) goto LAB_0011246b;
    s_00 = s;
    read_token(s);
    if (s->error == true) break;
  }
LAB_0011240d:
  do {
    do {
      do {
        do {
          error();
LAB_00112412:
          fVar9 = read_float(s_00);
          (unaff_R14->plane).a = fVar9;
        } while (s->error != false);
        s_00 = s;
        fVar9 = read_float(s);
        (unaff_R14->plane).b = fVar9;
      } while (s->error == true);
      s_00 = s;
      fVar9 = read_float(s);
      (unaff_R14->plane).d = fVar9;
    } while (s->error == true);
    s_00 = s;
    fVar9 = read_float(s);
    (unaff_R14->plane).scale = fVar9;
  } while (s->error == true);
LAB_0011246b:
  nd.get_image = (unaff_R14->base).get_image;
  memcpy(unaff_R14,&nd,0x90);
  return &unaff_R14->base;
}

Assistant:

fe_node* fe_load_node(fe_state& s)
{
    read_token(s);
    CHECK_ERR();

    if (*s.token != '*')
        s.error = 1;
    s.token++;//skip *
    CHECK_ERR();

    fe_node nd;   
    fe_node_init(&nd, 0, 0);

    nd.type = atoi(s.token);
    nd.id = READ_INT(s);
    nd.flags = READ_INT(s);
    nd.x = READ_INT(s);
    nd.y = READ_INT(s);
    nd.vis_x = READ_INT(s);
    nd.vis_y = READ_INT(s);
    

    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_float[i] = READ_FLOAT(s);
    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_int[i] = READ_INT(s);
    
    read_token(s);
    CHECK_ERR();

    safe_strcpy(nd.name, s.token);


    fe_node* node = 0;
    switch (nd.type)
    {
        case fe_node_type_source_image:
            node = &fe_node_image_alloc()->base;
            break;

        case fe_node_type_image_fixed:
            node = &fe_node_image_fixed_alloc()->base;
            break;

        case fe_node_type_fill:
        {
            fe_node_fill* nf = fe_node_fill_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

            fe_plane &plane = nf->plane;
            plane.a = READ_FLOAT(s);
            plane.b = READ_FLOAT(s);
            plane.d = READ_FLOAT(s);
            plane.scale = READ_FLOAT(s);

        } break;

        case fe_node_type_fill_radial:
        {
            fe_node_fill_radial* nf = fe_node_fill_radial_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

        } break;

        default:
        {
            node = fe_node_alloc(nd.type);
            break;
        }
    }
        
    nd.get_image = node->get_image;
    memcpy(node, &nd, sizeof(nd));

    return node;
}